

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getaddrinfo.c
# Opt level: O0

int run_test_getaddrinfo_fail(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined1 local_a8 [8];
  uv_getaddrinfo_t req;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_getaddrinfo(puVar2,(uv_getaddrinfo_t *)local_a8,abort,(char *)0x0,(char *)0x0,
                         (addrinfo *)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getaddrinfo.c"
            ,0x5b,
            "UV_EINVAL == uv_getaddrinfo(uv_default_loop(), &req, (uv_getaddrinfo_cb) abort, NULL, NULL, NULL)"
           );
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_getaddrinfo(puVar2,(uv_getaddrinfo_t *)local_a8,getaddrinfo_fail_cb,
                         "xyzzy.xyzzy.xyzzy.",(char *)0x0,(addrinfo *)0x0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getaddrinfo.c"
            ,99,
            "0 == uv_getaddrinfo(uv_default_loop(), &req, getaddrinfo_fail_cb, \"xyzzy.xyzzy.xyzzy.\", NULL, NULL)"
           );
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getaddrinfo.c"
            ,100,"0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT)");
    abort();
  }
  if (fail_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getaddrinfo.c"
            ,0x65,"fail_cb_called == 1");
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getaddrinfo.c"
            ,0x67,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(getaddrinfo_fail) {
  uv_getaddrinfo_t req;

  ASSERT(UV_EINVAL == uv_getaddrinfo(uv_default_loop(),
                                     &req,
                                     (uv_getaddrinfo_cb) abort,
                                     NULL,
                                     NULL,
                                     NULL));

  /* Use a FQDN by ending in a period */
  ASSERT(0 == uv_getaddrinfo(uv_default_loop(),
                             &req,
                             getaddrinfo_fail_cb,
                             "xyzzy.xyzzy.xyzzy.",
                             NULL,
                             NULL));
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT(fail_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}